

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

bool __thiscall CConnman::InitBinds(CConnman *this,Options *options)

{
  long lVar1;
  bool bVar2;
  uint16_t uVar3;
  CConnman *this_00;
  long lVar4;
  long in_RSI;
  long in_FS_OFFSET;
  CService *addr_bind;
  vector<CService,_std::allocator<CService>_> *__range1_2;
  NetWhitebindPermissions *addrBind_1;
  vector<NetWhitebindPermissions,_std::allocator<NetWhitebindPermissions>_> *__range1_1;
  CService *addrBind;
  vector<CService,_std::allocator<CService>_> *__range1;
  in_addr inaddr_any;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  const_iterator __end1;
  const_iterator __begin1;
  CService ipv4_any;
  CService ipv6_any;
  undefined6 in_stack_fffffffffffffee8;
  uint16_t in_stack_fffffffffffffeee;
  vector<CService,_std::allocator<CService>_> *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffefc;
  undefined1 in_stack_fffffffffffffefd;
  undefined2 in_stack_fffffffffffffefe;
  undefined8 in_stack_ffffffffffffff38;
  reference in_stack_ffffffffffffff40;
  byte local_9d;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (CConnman *)(in_RSI + 0xa0);
  std::vector<CService,_std::allocator<CService>_>::begin(in_stack_fffffffffffffef0);
  std::vector<CService,_std::allocator<CService>_>::end(in_stack_fffffffffffffef0);
  while (bVar2 = __gnu_cxx::
                 operator==<const_CService_*,_std::vector<CService,_std::allocator<CService>_>_>
                           ((__normal_iterator<const_CService_*,_std::vector<CService,_std::allocator<CService>_>_>
                             *)CONCAT26(in_stack_fffffffffffffefe,
                                        CONCAT15(in_stack_fffffffffffffefd,
                                                 CONCAT14(in_stack_fffffffffffffefc,
                                                          in_stack_fffffffffffffef8))),
                            (__normal_iterator<const_CService_*,_std::vector<CService,_std::allocator<CService>_>_>
                             *)in_stack_fffffffffffffef0), ((bVar2 ^ 0xffU) & 1) != 0) {
    in_stack_ffffffffffffff40 =
         __gnu_cxx::
         __normal_iterator<const_CService_*,_std::vector<CService,_std::allocator<CService>_>_>::
         operator*((__normal_iterator<const_CService_*,_std::vector<CService,_std::allocator<CService>_>_>
                    *)CONCAT26(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8));
    bVar2 = Bind(this_00,in_stack_ffffffffffffff40,(uint)((ulong)in_stack_ffffffffffffff38 >> 0x20),
                 (NetPermissionFlags)in_stack_ffffffffffffff38);
    if (!bVar2) {
      local_9d = 0;
      goto LAB_0021c0be;
    }
    __gnu_cxx::
    __normal_iterator<const_CService_*,_std::vector<CService,_std::allocator<CService>_>_>::
    operator++((__normal_iterator<const_CService_*,_std::vector<CService,_std::allocator<CService>_>_>
                *)CONCAT26(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8));
  }
  lVar4 = in_RSI + 0x88;
  std::vector<NetWhitebindPermissions,_std::allocator<NetWhitebindPermissions>_>::begin
            ((vector<NetWhitebindPermissions,_std::allocator<NetWhitebindPermissions>_> *)
             in_stack_fffffffffffffef0);
  std::vector<NetWhitebindPermissions,_std::allocator<NetWhitebindPermissions>_>::end
            ((vector<NetWhitebindPermissions,_std::allocator<NetWhitebindPermissions>_> *)
             in_stack_fffffffffffffef0);
  while (bVar2 = __gnu_cxx::
                 operator==<const_NetWhitebindPermissions_*,_std::vector<NetWhitebindPermissions,_std::allocator<NetWhitebindPermissions>_>_>
                           ((__normal_iterator<const_NetWhitebindPermissions_*,_std::vector<NetWhitebindPermissions,_std::allocator<NetWhitebindPermissions>_>_>
                             *)CONCAT26(in_stack_fffffffffffffefe,
                                        CONCAT15(in_stack_fffffffffffffefd,
                                                 CONCAT14(in_stack_fffffffffffffefc,
                                                          in_stack_fffffffffffffef8))),
                            (__normal_iterator<const_NetWhitebindPermissions_*,_std::vector<NetWhitebindPermissions,_std::allocator<NetWhitebindPermissions>_>_>
                             *)in_stack_fffffffffffffef0), ((bVar2 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<const_NetWhitebindPermissions_*,_std::vector<NetWhitebindPermissions,_std::allocator<NetWhitebindPermissions>_>_>
    ::operator*((__normal_iterator<const_NetWhitebindPermissions_*,_std::vector<NetWhitebindPermissions,_std::allocator<NetWhitebindPermissions>_>_>
                 *)CONCAT26(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8));
    bVar2 = Bind(this_00,in_stack_ffffffffffffff40,(uint)((ulong)lVar4 >> 0x20),
                 (NetPermissionFlags)lVar4);
    if (!bVar2) {
      local_9d = 0;
      goto LAB_0021c0be;
    }
    __gnu_cxx::
    __normal_iterator<const_NetWhitebindPermissions_*,_std::vector<NetWhitebindPermissions,_std::allocator<NetWhitebindPermissions>_>_>
    ::operator++((__normal_iterator<const_NetWhitebindPermissions_*,_std::vector<NetWhitebindPermissions,_std::allocator<NetWhitebindPermissions>_>_>
                  *)CONCAT26(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8));
  }
  std::vector<CService,_std::allocator<CService>_>::begin(in_stack_fffffffffffffef0);
  std::vector<CService,_std::allocator<CService>_>::end(in_stack_fffffffffffffef0);
  while (bVar2 = __gnu_cxx::
                 operator==<const_CService_*,_std::vector<CService,_std::allocator<CService>_>_>
                           ((__normal_iterator<const_CService_*,_std::vector<CService,_std::allocator<CService>_>_>
                             *)CONCAT26(in_stack_fffffffffffffefe,
                                        CONCAT15(in_stack_fffffffffffffefd,
                                                 CONCAT14(in_stack_fffffffffffffefc,
                                                          in_stack_fffffffffffffef8))),
                            (__normal_iterator<const_CService_*,_std::vector<CService,_std::allocator<CService>_>_>
                             *)in_stack_fffffffffffffef0), ((bVar2 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<const_CService_*,_std::vector<CService,_std::allocator<CService>_>_>::
    operator*((__normal_iterator<const_CService_*,_std::vector<CService,_std::allocator<CService>_>_>
               *)CONCAT26(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8));
    bVar2 = Bind(this_00,in_stack_ffffffffffffff40,(uint)((ulong)lVar4 >> 0x20),
                 (NetPermissionFlags)lVar4);
    if (!bVar2) {
      local_9d = 0;
      goto LAB_0021c0be;
    }
    __gnu_cxx::
    __normal_iterator<const_CService_*,_std::vector<CService,_std::allocator<CService>_>_>::
    operator++((__normal_iterator<const_CService_*,_std::vector<CService,_std::allocator<CService>_>_>
                *)CONCAT26(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8));
  }
  if ((*(byte *)(in_RSI + 0xd0) & 1) != 0) {
    GetListenPort();
    CService::CService((CService *)
                       CONCAT26(in_stack_fffffffffffffefe,
                                CONCAT15(in_stack_fffffffffffffefd,
                                         CONCAT14(in_stack_fffffffffffffefc,
                                                  in_stack_fffffffffffffef8))),
                       (in6_addr *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeee);
    Bind(this_00,in_stack_ffffffffffffff40,(uint)((ulong)lVar4 >> 0x20),(NetPermissionFlags)lVar4);
    htonl(0);
    uVar3 = GetListenPort();
    CService::CService((CService *)
                       CONCAT26(uVar3,CONCAT15(in_stack_fffffffffffffefd,
                                               CONCAT14(in_stack_fffffffffffffefc,
                                                        in_stack_fffffffffffffef8))),
                       (in_addr *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeee);
    bVar2 = Bind(this_00,in_stack_ffffffffffffff40,(uint)((ulong)lVar4 >> 0x20),
                 (NetPermissionFlags)lVar4);
    if (!bVar2) {
      local_9d = 0;
    }
    CService::~CService((CService *)CONCAT26(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8));
    CService::~CService((CService *)CONCAT26(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8));
    if (!bVar2) goto LAB_0021c0be;
  }
  local_9d = 1;
LAB_0021c0be:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (bool)(local_9d & 1);
}

Assistant:

bool CConnman::InitBinds(const Options& options)
{
    for (const auto& addrBind : options.vBinds) {
        if (!Bind(addrBind, BF_REPORT_ERROR, NetPermissionFlags::None)) {
            return false;
        }
    }
    for (const auto& addrBind : options.vWhiteBinds) {
        if (!Bind(addrBind.m_service, BF_REPORT_ERROR, addrBind.m_flags)) {
            return false;
        }
    }
    for (const auto& addr_bind : options.onion_binds) {
        if (!Bind(addr_bind, BF_REPORT_ERROR | BF_DONT_ADVERTISE, NetPermissionFlags::None)) {
            return false;
        }
    }
    if (options.bind_on_any) {
        // Don't consider errors to bind on IPv6 "::" fatal because the host OS
        // may not have IPv6 support and the user did not explicitly ask us to
        // bind on that.
        const CService ipv6_any{in6_addr(IN6ADDR_ANY_INIT), GetListenPort()}; // ::
        Bind(ipv6_any, BF_NONE, NetPermissionFlags::None);

        struct in_addr inaddr_any;
        inaddr_any.s_addr = htonl(INADDR_ANY);
        const CService ipv4_any{inaddr_any, GetListenPort()}; // 0.0.0.0
        if (!Bind(ipv4_any, BF_REPORT_ERROR, NetPermissionFlags::None)) {
            return false;
        }
    }
    return true;
}